

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerOperation.cpp
# Opt level: O3

void __thiscall ServerOperation::ServerOperation(ServerOperation *this,char *directory)

{
  this->_vptr_ServerOperation = (_func_int **)&PTR___cxa_pure_virtual_00109cb8;
  (this->statusMessage)._M_dataplus._M_p = (pointer)&(this->statusMessage).field_2;
  (this->statusMessage)._M_string_length = 0;
  (this->statusMessage).field_2._M_local_buf[0] = '\0';
  builtin_strncpy(this->USERDIR,"users",6);
  builtin_strncpy(this->SUCCESS,"OK\n",4);
  builtin_strncpy(this->FAILURE,"ERR\n",5);
  builtin_strncpy(this->EXECUTEPENDING,"EP\n",4);
  std::__cxx11::string::_M_replace((ulong)&this->statusMessage,0,(char *)0x0,0x10719f);
  this->MESSAGEDIR = directory;
  return;
}

Assistant:

ServerOperation::ServerOperation(const char * directory) {
    //nothing has to be done
    statusMessage = "expecting parameter.\n";
    MESSAGEDIR = directory;
}